

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

bool __thiscall cmDocumentation::PrintHelpListGenerators(cmDocumentation *this,ostream *os)

{
  iterator os_00;
  bool bVar1;
  pointer ppVar2;
  _Self local_68 [3];
  allocator local_49;
  key_type local_48;
  _Base_ptr local_28;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*>_>
  local_20;
  iterator si;
  ostream *os_local;
  cmDocumentation *this_local;
  
  si._M_node = (_Base_ptr)os;
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*>_>
  ::_Rb_tree_iterator(&local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"Generators",&local_49);
  local_28 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*>_>_>
             ::find(&this->AllSections,&local_48);
  local_20._M_node = local_28;
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*>_>_>
       ::end(&this->AllSections);
  bVar1 = std::operator!=(&local_20,local_68);
  if (bVar1) {
    cmDocumentationFormatter::SetIndent(&this->Formatter,"  ");
    os_00 = si;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*>_>
             ::operator->(&local_20);
    cmDocumentationFormatter::PrintSection(&this->Formatter,(ostream *)os_00._M_node,ppVar2->second)
    ;
  }
  return true;
}

Assistant:

bool cmDocumentation::PrintHelpListGenerators(std::ostream& os)
{
  std::map<std::string, cmDocumentationSection*>::iterator si;
  si = this->AllSections.find("Generators");
  if (si != this->AllSections.end()) {
    this->Formatter.SetIndent("  ");
    this->Formatter.PrintSection(os, *si->second);
  }
  return true;
}